

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scrambler.cxx
# Opt level: O2

void __thiscall xray_re::xr_scrambler::init_sboxes(xr_scrambler *this,int seed,int size_mult)

{
  uint8_t uVar1;
  int i;
  uint uVar2;
  long lVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  ulong uVar3;
  
  for (uVar3 = 0xff; -1 < (int)uVar3; uVar3 = (ulong)((int)uVar3 - 1)) {
    this->m_enc_sbox[uVar3] = (uint8_t)uVar3;
  }
  iVar6 = size_mult << 8;
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    seed = seed * 0x8088405 + 1;
    uVar2 = (uint)seed >> 0x18;
    do {
      seed = seed * 0x8088405 + 1;
      uVar5 = (uint)seed >> 0x18;
    } while (uVar2 == uVar5);
    uVar1 = this->m_enc_sbox[uVar2];
    this->m_enc_sbox[uVar2] = this->m_enc_sbox[uVar5];
    this->m_enc_sbox[uVar5] = uVar1;
  }
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    this->m_dec_sbox[this->m_enc_sbox[lVar4]] = (uint8_t)lVar4;
  }
  return;
}

Assistant:

void xr_scrambler::init_sboxes(int seed, int size_mult)
{
	for (int i = SBOX_SIZE - 1; i >= 0; --i)
		m_enc_sbox[i] = uint8_t(i);
	for (int i = size_mult*SBOX_SIZE, a, b; i != 0; --i) {
		seed = 1 + seed * SEED_MULT;
		a = (seed >> 24) & 0xff;
		do {
			seed = 1 + seed * SEED_MULT;
			b = (seed >> 24) & 0xff;
		} while (a == b);
		std::swap(m_enc_sbox[a], m_enc_sbox[b]);
	}
	for (int i = 0; i != SBOX_SIZE; ++i)
		m_dec_sbox[m_enc_sbox[i]] = uint8_t(i);
}